

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O1

BVSparse<Memory::JitArenaAllocator> * __thiscall
HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::GetAndClear
          (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *this,int value)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  DictionaryStats *this_01;
  bool bVar1;
  SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
  *buffer;
  NodeBase *pNVar2;
  bool bVar3;
  Type *pTVar4;
  int iVar5;
  undefined1 local_60 [8];
  EditingIterator iter;
  BVSparse<Memory::JitArenaAllocator> *local_40;
  
  local_60 = (undefined1  [8])(this->table + (ulong)(uint)value % (ulong)this->tableSize);
  iter.super_Iterator.current = (NodeBase *)0x0;
  bVar1 = true;
  iter.super_Iterator.list =
       (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
        *)local_60;
  iter.last = (NodeBase *)this;
  do {
    bVar3 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
            ::EditingIterator::Next((EditingIterator *)local_60);
    if (!bVar3) goto LAB_0063c52a;
    pTVar4 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
             ::Iterator::Data((Iterator *)local_60);
    pNVar2 = iter.last;
    buffer = iter.super_Iterator.list;
    iVar5 = 0;
    if (value < pTVar4->value) {
      bVar1 = false;
    }
    else {
      iVar5 = 3;
      if (pTVar4->value == value) {
        local_40 = pTVar4->element;
        this_00 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                  (iter.last)->next;
        SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
        ::EditingIterator::UnlinkCurrentNode((EditingIterator *)local_60);
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                  (this_00,buffer,0x18);
        this_01 = (DictionaryStats *)pNVar2[3].next;
        iVar5 = 1;
        if (this_01 != (DictionaryStats *)0x0) {
          if (bVar1) {
            bVar3 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                    ::EditingIterator::Next((EditingIterator *)local_60);
            bVar3 = !bVar3;
          }
          else {
            bVar3 = false;
          }
          DictionaryStats::Remove(this_01,bVar3);
        }
      }
    }
  } while (iVar5 == 0);
  if (iVar5 == 3) {
LAB_0063c52a:
    local_40 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  return local_40;
}

Assistant:

T GetAndClear(int value)
    {
        SListBase<Bucket<T>> * list = &this->table[this->Hash(value)];

#if PROFILE_DICTIONARY
        bool first = true;
#endif
        // Assumes sorted lists
        FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, list, iter)
        {
            if (bucket.value <= value)
            {
                if (bucket.value == value)
                {
                    T retVal = bucket.element;
                    iter.RemoveCurrent(this->alloc);
#if PROFILE_DICTIONARY
                    if (stats)
                        stats->Remove(first && !(iter.Next()));
#endif
                    return retVal;
                }
                break;
            }
#if PROFILE_DICTIONARY
        first = false;
#endif
        } NEXT_SLISTBASE_ENTRY_EDITING;
        return T();
    }